

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

Ref<anurbs::BrepLoop> __thiscall
pybind11::detail::argument_loader<anurbs::Model&,unsigned_long,std::shared_ptr<anurbs::BrepLoop>>::
call_impl<anurbs::Ref<anurbs::BrepLoop>,anurbs::Ref<anurbs::BrepLoop>(*&)(anurbs::Model&,unsigned_long,std::shared_ptr<anurbs::BrepLoop>),0ul,1ul,2ul,pybind11::detail::void_type>
          (argument_loader<anurbs::Model&,unsigned_long,std::shared_ptr<anurbs::BrepLoop>> *this,
          tuple<pybind11::detail::type_caster<anurbs::Model,_void>,_pybind11::detail::type_caster<unsigned_long,_void>,_pybind11::detail::type_caster<std::shared_ptr<anurbs::BrepLoop>,_void>_>
          *f,void_type *param_3,undefined8 param_4)

{
  code *pcVar1;
  unsigned_long uVar2;
  __tuple_element_t<0UL,_tuple<type_caster<Model,_void>,_type_caster<unsigned_long,_void>,_type_caster<shared_ptr<BrepLoop>,_void>_>_>
  *caster;
  template_cast_op_type<typename_std::add_rvalue_reference<Model_&>::type> pMVar3;
  __tuple_element_t<1UL,_tuple<type_caster<Model,_void>,_type_caster<unsigned_long,_void>,_type_caster<shared_ptr<BrepLoop>,_void>_>_>
  *caster_00;
  template_cast_op_type<typename_std::add_rvalue_reference<unsigned_long>::type> puVar4;
  __tuple_element_t<2UL,_tuple<type_caster<Model,_void>,_type_caster<unsigned_long,_void>,_type_caster<shared_ptr<BrepLoop>,_void>_>_>
  *caster_01;
  template_cast_op_type<typename_std::add_rvalue_reference<shared_ptr<BrepLoop>_>::type> psVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::BrepLoop> RVar6;
  shared_ptr<anurbs::BrepLoop> local_40;
  undefined8 local_30;
  void_type *param_3_local;
  _func_Ref<anurbs::BrepLoop>_Model_ptr_unsigned_long_shared_ptr<anurbs::BrepLoop> **f_local;
  argument_loader<anurbs::Model_&,_unsigned_long,_std::shared_ptr<anurbs::BrepLoop>_> *this_local;
  argument_loader<anurbs::Model&,unsigned_long,std::shared_ptr<anurbs::BrepLoop>> *local_10;
  
  pcVar1 = *(code **)param_3;
  local_30 = param_4;
  param_3_local = param_3;
  f_local = (_func_Ref<anurbs::BrepLoop>_Model_ptr_unsigned_long_shared_ptr<anurbs::BrepLoop> **)f;
  local_10 = this;
  caster = std::
           get<0ul,pybind11::detail::type_caster<anurbs::Model,void>,pybind11::detail::type_caster<unsigned_long,void>,pybind11::detail::type_caster<std::shared_ptr<anurbs::BrepLoop>,void>>
                     (f);
  pMVar3 = cast_op<anurbs::Model&>(caster);
  caster_00 = std::
              get<1ul,pybind11::detail::type_caster<anurbs::Model,void>,pybind11::detail::type_caster<unsigned_long,void>,pybind11::detail::type_caster<std::shared_ptr<anurbs::BrepLoop>,void>>
                        (f);
  puVar4 = cast_op<unsigned_long>(caster_00);
  uVar2 = *puVar4;
  caster_01 = std::
              get<2ul,pybind11::detail::type_caster<anurbs::Model,void>,pybind11::detail::type_caster<unsigned_long,void>,pybind11::detail::type_caster<std::shared_ptr<anurbs::BrepLoop>,void>>
                        (f);
  psVar5 = cast_op<std::shared_ptr<anurbs::BrepLoop>>(caster_01);
  std::shared_ptr<anurbs::BrepLoop>::shared_ptr(&local_40,psVar5);
  (*pcVar1)(this,pMVar3,uVar2,&local_40);
  std::shared_ptr<anurbs::BrepLoop>::~shared_ptr(&local_40);
  RVar6.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar6.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::BrepLoop>)
         RVar6.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }